

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O0

double __thiscall
AbstractIsolineTracer<double>::determine_c_parametric(AbstractIsolineTracer<double> *this)

{
  Scalar SVar1;
  double dVar2;
  double dVar3;
  Index IVar4;
  bool bVar5;
  Index IVar6;
  Scalar *pSVar7;
  reference pvVar8;
  size_type __n;
  Scalar local_b8;
  CmpLTReturnType local_b0;
  int local_88;
  int local_84;
  int i;
  ArrayXd newrho;
  double dt;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> f;
  allocator<double> local_31;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> rhovec;
  AbstractIsolineTracer<double> *this_local;
  
  if (this->mode == STEP_PARAMETRIC) {
    rhovec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)this;
    IVar6 = Eigen::EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)
                       &(this->m_initial_state).rhovecL);
    std::allocator<double>::allocator(&local_31);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_30,IVar6 * 2,&local_31);
    std::allocator<double>::~allocator(&local_31);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)
                        &(this->m_initial_state).rhovecL,0);
    SVar1 = *pSVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,0);
    *pvVar8 = SVar1;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)
                        &(this->m_initial_state).rhovecL,1);
    SVar1 = *pSVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,1);
    *pvVar8 = SVar1;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)
                        &(this->m_initial_state).rhovecV,0);
    SVar1 = *pSVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,2);
    *pvVar8 = SVar1;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)
                        &(this->m_initial_state).rhovecV,1);
    SVar1 = *pSVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,3);
    *pvVar8 = SVar1;
    __n = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_30);
    std::allocator<double>::allocator((allocator<double> *)((long)&dt + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_60,__n,
               (allocator<double> *)((long)&dt + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&dt + 7));
    (*(this->super_AbstractODEIntegrator)._vptr_AbstractODEIntegrator[5])
              (this->m_T,this,local_30,local_60);
    newrho.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         0x3eb0c6f7a0b5ed8d;
    local_84 = 4;
    Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<int>
              ((Array<double,__1,_1,_0,__1,_1> *)&i,&local_84);
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_30,(long)local_88);
      IVar4 = newrho.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      dVar2 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_60,(long)local_88);
      dVar3 = *pvVar8;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&i,
                          (long)local_88);
      *pSVar7 = (double)IVar4 * dVar3 + dVar2;
    }
    local_b8 = 0.0;
    Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator<
              (&local_b0,(ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&i,&local_b8);
    bVar5 = Eigen::
            DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
            ::any((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                   *)&local_b0);
    if (bVar5) {
      this_local = (AbstractIsolineTracer<double> *)0xbff0000000000000;
    }
    else {
      this_local = (AbstractIsolineTracer<double> *)0x3ff0000000000000;
    }
    Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)&i);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_60);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_30);
  }
  else {
    this_local = (AbstractIsolineTracer<double> *)0x3ff0000000000000;
  }
  return (double)this_local;
}

Assistant:

double determine_c_parametric() {
        if (mode == STEP_PARAMETRIC) {
            std::vector<TYPE> rhovec(m_initial_state.rhovecL.size()*2);
            rhovec[0] = m_initial_state.rhovecL[0];
            rhovec[1] = m_initial_state.rhovecL[1];
            rhovec[2] = m_initial_state.rhovecV[0];
            rhovec[3] = m_initial_state.rhovecV[1];
            std::vector<TYPE> f(rhovec.size());
            derivs(m_T, rhovec, f);
            double dt = 1e-6;
            Eigen::ArrayXd newrho(4);
            for (auto i = 0; i < 4; ++i) {
                newrho[i] = rhovec[i] + dt * f[i];
            }
            if ((newrho < 0).any()) {
                return -1;
            }
            else{
                return 1;
            }
        }
        else {
            return 1.0;
        }
    }